

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerDriver.cpp
# Opt level: O2

bool test_Player_attack(void)

{
  int iVar1;
  GameLoop *pGVar2;
  reference ppPVar3;
  
  GameLoop::start();
  pGVar2 = GameLoop::getInstance();
  GameLoop::distributeArmies(pGVar2);
  pGVar2 = GameLoop::getInstance();
  ppPVar3 = std::vector<Player_*,_std::allocator<Player_*>_>::at(pGVar2->allPlayers,0);
  iVar1 = Player::attack(*ppPVar3);
  GameLoop::resetInstance();
  return iVar1 != -1;
}

Assistant:

bool test_Player_attack() {

    // Arrange
    bool success = true;
    GameLoop::start();
    GameLoop::getInstance()->distributeArmies(); // because you need armies to attack
    if (GameLoop::getInstance()->getAllPlayers()->at(0)->attack() == PlayerAction::FAILED) {
        success = false;
    }
    GameLoop::resetInstance();
    return success;
}